

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_t sVar1;
  int iVar2;
  Runtime *this;
  ulong uVar3;
  char *pcVar4;
  Bracket *this_00;
  undefined4 extraout_var;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  Bracket *temp;
  list<Bracket_*,_std::allocator<Bracket_*>_> brackets;
  unsigned_long pos;
  undefined1 local_278 [12];
  undefined1 local_268 [12];
  undefined1 local_258 [8];
  string str;
  ifstream t;
  Runtime *runtime;
  char **argv_local;
  int argc_local;
  
  if (argc == 1) {
    Code::FinalShell();
  }
  else {
    this = (Runtime *)operator_new(8);
    Runtime::Runtime(this);
    std::ifstream::ifstream((istream_type *)(str.field_2._M_local_buf + 8),argv[1],8);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_268,
               (istream_type *)(str.field_2._M_local_buf + 8));
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_278);
    std::allocator<char>::allocator();
    __beg._12_4_ = 0;
    __beg._M_sbuf = (streambuf_type *)local_268._0_8_;
    __beg._M_c = local_268._8_4_;
    __end._12_4_ = 0;
    __end._M_sbuf = (streambuf_type *)local_278._0_8_;
    __end._M_c = local_278._8_4_;
    std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((string *)local_258,__beg,__end,(allocator<char> *)((long)&pos + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
    brackets.super__List_base<Bracket_*,_std::allocator<Bracket_*>_>._M_impl._M_node._M_size = 0;
    std::__cxx11::list<Bracket_*,_std::allocator<Bracket_*>_>::list
              ((list<Bracket_*,_std::allocator<Bracket_*>_> *)&temp);
    while (sVar1 = brackets.super__List_base<Bracket_*,_std::allocator<Bracket_*>_>._M_impl._M_node.
                   _M_size, uVar3 = std::__cxx11::string::length(), sVar1 < uVar3) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_258);
      if (*pcVar4 == '(') {
        this_00 = (Bracket *)operator_new(0x40);
        Bracket::Bracket(this_00,(string *)local_258,
                         &brackets.super__List_base<Bracket_*,_std::allocator<Bracket_*>_>._M_impl.
                          _M_node._M_size);
        iVar2 = (*(this_00->super_Atom)._vptr_Atom[3])(this_00,this);
        Data::check((Data *)CONCAT44(extraout_var,iVar2));
      }
      else {
        brackets.super__List_base<Bracket_*,_std::allocator<Bracket_*>_>._M_impl._M_node._M_size =
             brackets.super__List_base<Bracket_*,_std::allocator<Bracket_*>_>._M_impl._M_node.
             _M_size + 1;
      }
    }
    if (this != (Runtime *)0x0) {
      Runtime::~Runtime(this);
      operator_delete(this);
    }
    std::__cxx11::list<Bracket_*,_std::allocator<Bracket_*>_>::~list
              ((list<Bracket_*,_std::allocator<Bracket_*>_> *)&temp);
    std::__cxx11::string::~string((string *)local_258);
    std::ifstream::~ifstream((void *)((long)&str.field_2 + 8));
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc == 1) {
        Code::FinalShell();
    } else {
        auto runtime = new Runtime();
        std::ifstream t(argv[1]);
        std::string str((std::istreambuf_iterator<char>(t)), std::istreambuf_iterator<char>());
        unsigned long pos = 0;
        std::list<Bracket *> brackets;
        Bracket* temp;
        while (pos < str.length()) {
            if (str[pos] != '(') {
                pos++;
            } else {
                temp = new Bracket(str, pos);
                Data::check(temp->eval(runtime));
            }
        }
        delete runtime;
    }

    return 0;
}